

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::Promise<unsigned_long>_> * __thiscall
kj::anon_unknown_31::PromiseOutputStream::tryPumpFrom
          (Maybe<kj::Promise<unsigned_long>_> *__return_storage_ptr__,PromiseOutputStream *this,
          AsyncInputStream *input,uint64_t amount)

{
  AsyncOutputStream *pAVar1;
  PromiseNode *pPVar2;
  EventLoop *this_00;
  Own<kj::_::ChainPromiseNode> OVar3;
  undefined1 local_68 [8];
  PromiseNode *local_60;
  Own<kj::_::PromiseNode> local_58;
  bool local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  kj local_38 [8];
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pAVar1 = (this->stream).ptr.ptr;
  if (pAVar1 == (AsyncOutputStream *)0x0) {
    _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_68);
    this_00 = (EventLoop *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(Own<kj::_::PromiseNode> *)local_68,
               _::
               TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3552:39),_kj::_::PropagateException>
               ::anon_class_24_3_e7c12ea1_for_func::operator());
    ((PromiseNode *)&this_00->port)->_vptr_PromiseNode = (_func_int **)&PTR_onReady_004452e8;
    this_00->depthFirstInsertPoint = (Event **)this;
    (this_00->daemons).disposer = (Disposer *)input;
    (this_00->daemons).ptr = (TaskSet *)amount;
    local_58.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::PromiseOutputStream::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_58.ptr = (PromiseNode *)this_00;
    OVar3 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>(local_38,&local_58);
    pPVar2 = local_58.ptr;
    if ((EventLoop *)local_58.ptr != (EventLoop *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      local_48 = (bool)local_38[0];
      uStack_47 = local_38[1];
      uStack_46 = local_38[2];
      uStack_45 = local_38[3];
      uStack_44 = local_38[4];
      uStack_43 = local_38[5];
      uStack_42 = local_38[6];
      uStack_41 = local_38[7];
      uStack_40 = uStack_30;
      uStack_3c = uStack_2c;
      (**(local_58.disposer)->_vptr_Disposer)
                (local_58.disposer,
                 ((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode,OVar3.ptr);
      local_38._0_4_ = _local_48;
      local_38._4_4_ = _uStack_44;
      uStack_30 = uStack_40;
      uStack_2c = uStack_3c;
    }
    pPVar2 = local_60;
    (__return_storage_ptr__->ptr).isSet = true;
    *(undefined4 *)&(__return_storage_ptr__->ptr).field_1 = local_38._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 4) = local_38._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = uStack_30;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xc) = uStack_2c;
    if (local_60 != (PromiseNode *)0x0) {
      local_60 = (PromiseNode *)0x0;
      (**(code **)*(_func_int **)local_68)
                (local_68,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
    }
  }
  else {
    (*pAVar1->_vptr_AsyncOutputStream[2])(__return_storage_ptr__,pAVar1,input,amount);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> tryPumpFrom(
      kj::AsyncInputStream& input, uint64_t amount = kj::maxValue) override {
    KJ_IF_MAYBE(s, stream) {
      return s->get()->tryPumpFrom(input, amount);
    } else {
      return promise.addBranch().then([this,&input,amount]() {
        // Call input.pumpTo() on the resolved stream instead.
        return input.pumpTo(*KJ_ASSERT_NONNULL(stream), amount);
      });
    }
  }